

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar2;
  double *pdVar3;
  value_type vVar4;
  double dVar5;
  double dVar6;
  value_type vVar7;
  
  vVar4 = FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>
          ::dx(&((this->left_->fadexpr_).expr_)->fadexpr_,i);
  dVar5 = sin((this->right_->fadexpr_).expr_.val_);
  pFVar2 = this->right_;
  pdVar3 = &(pFVar2->fadexpr_).expr_.defaultVal;
  if ((pFVar2->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar3 = (pFVar2->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar1 = *pdVar3;
  dVar6 = cos((pFVar2->fadexpr_).expr_.val_);
  vVar7 = FadUnaryMin<FadExpr<FadBinaryAdd<FadExpr<FadFuncExp<FadExpr<FadUnaryMin<Fad<double>_>_>_>_>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>_>
          ::val(&this->left_->fadexpr_);
  return vVar7 * dVar6 * dVar1 - dVar5 * vVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}